

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O0

void __thiscall cmInstallFilesGenerator::~cmInstallFilesGenerator(cmInstallFilesGenerator *this)

{
  cmInstallFilesGenerator *this_local;
  
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallFilesGenerator_00b18db8;
  std::__cxx11::string::~string((string *)&this->Rename);
  std::__cxx11::string::~string((string *)&this->FilePermissions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Files);
  cmInstallGenerator::~cmInstallGenerator(&this->super_cmInstallGenerator);
  return;
}

Assistant:

cmInstallFilesGenerator
::~cmInstallFilesGenerator()
{
}